

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>::emplace_back<>
          (SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *this)

{
  SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *in_RDI;
  pointer in_stack_00000038;
  SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *in_stack_00000040;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<>(in_stack_00000040,in_stack_00000038);
  }
  else {
    end(in_RDI);
    SmallVector<slang::SmallVector<int,_10UL>,_2UL>::SmallVector
              ((SmallVector<slang::SmallVector<int,_10UL>,_2UL> *)0x928bd9);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }